

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall ON_NurbsCage::Write(ON_NurbsCage *this,ON_BinaryArchive *archive)

{
  long lVar1;
  ON_BinaryArchive *pOVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double *p;
  double *pdVar10;
  int iVar11;
  double adStack_60 [2];
  ulong local_50;
  int local_44;
  ulong local_40;
  ON_BinaryArchive *local_38;
  
  adStack_60[0] = 2.76121777731125e-317;
  bVar3 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar3) {
    adStack_60[0] = 2.76122963488675e-317;
    local_38 = archive;
    bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_dim);
    if (bVar4) {
      adStack_60[0] = 2.76124001026531e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,(uint)this->m_is_rat);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76125038564387e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,this->m_order[0]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76126076102243e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,this->m_order[1]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.761271136401e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,this->m_order[2]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76128151177956e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,this->m_cv_count[0]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76129188715812e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,this->m_cv_count[1]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76130226253668e-317;
      bVar4 = ON_BinaryArchive::WriteInt(local_38,this->m_cv_count[2]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76131263791525e-317;
      iVar5 = ON_KnotCount(this->m_order[0],this->m_cv_count[0]);
      adStack_60[0] = 2.76132054296558e-317;
      bVar4 = ON_BinaryArchive::WriteDouble(local_38,(long)iVar5,this->m_knot[0]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76133091834414e-317;
      iVar5 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
      adStack_60[0] = 2.76133882339448e-317;
      bVar4 = ON_BinaryArchive::WriteDouble(local_38,(long)iVar5,this->m_knot[1]);
    }
    if (bVar4 != false) {
      adStack_60[0] = 2.76134919877304e-317;
      iVar5 = ON_KnotCount(this->m_order[2],this->m_cv_count[2]);
      adStack_60[0] = 2.76135710382337e-317;
      bVar4 = ON_BinaryArchive::WriteDouble(local_38,(long)iVar5,this->m_knot[2]);
    }
    local_50 = (long)this->m_dim + (ulong)this->m_is_rat;
    lVar1 = -(local_50 * 8 + 0xf & 0xfffffffffffffff0);
    pdVar10 = (double *)((long)adStack_60 + lVar1 + 8);
    if (0 < (int)local_50) {
      uVar8 = local_50 & 0xffffffff;
      uVar9 = 0;
      do {
        pdVar10[uVar9] = -1.23432101234321e+308;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (bVar4 == true && 0 < this->m_cv_count[0]) {
      local_40 = 0;
      do {
        if ((0 < this->m_cv_count[1]) && (bVar4 != false)) {
          iVar5 = 0;
          adStack_60[1] = (double)(long)(int)local_40;
          do {
            iVar6 = iVar5;
            if ((0 < this->m_cv_count[2]) && (bVar4 != false)) {
              iVar11 = 1;
              local_44 = iVar5;
              do {
                pOVar2 = local_38;
                uVar8 = local_50;
                if (this->m_cv == (double *)0x0) {
                  p = (double *)0x0;
                }
                else {
                  p = this->m_cv +
                      (long)this->m_cv_stride[0] * (long)adStack_60[1] +
                      (long)this->m_cv_stride[1] * (long)iVar5 +
                      (long)(iVar11 + -1) * (long)this->m_cv_stride[2];
                }
                if (p == (double *)0x0) {
                  p = pdVar10;
                }
                *(undefined8 *)((long)adStack_60 + lVar1) = 0x554924;
                bVar4 = ON_BinaryArchive::WriteDouble(pOVar2,uVar8,p);
                iVar6 = local_44;
              } while ((iVar11 < this->m_cv_count[2]) && (iVar11 = iVar11 + 1, bVar4));
            }
            iVar5 = iVar6 + 1;
          } while ((iVar5 < this->m_cv_count[1]) && (bVar4 != false));
        }
        uVar7 = (int)local_40 + 1;
        local_40 = (ulong)uVar7;
      } while (((int)uVar7 < this->m_cv_count[0]) && (bVar4 != false));
    }
    pOVar2 = local_38;
    *(undefined8 *)((long)adStack_60 + lVar1) = 0x55496d;
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(pOVar2);
    bVar3 = (bool)(bVar3 & bVar4);
  }
  return bVar3;
}

Assistant:

bool ON_NurbsCage::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);

  if (rc)
  {
    rc = archive.WriteInt(m_dim);
    if(rc)
      rc = archive.WriteInt(m_is_rat);

    if (rc)
      rc = archive.WriteInt(m_order[0]);
    if (rc)
      rc = archive.WriteInt(m_order[1]);
    if (rc)
      rc = archive.WriteInt(m_order[2]);

    if (rc)
      rc = archive.WriteInt(m_cv_count[0]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[1]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[2]);

    if (rc)
      rc = archive.WriteDouble(KnotCount(0),m_knot[0]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(1),m_knot[1]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(2),m_knot[2]);

    int i,j,k;
    const int cv_dim = m_is_rat?(m_dim+1):m_dim;
    double* bogus_cv = (double*)alloca(cv_dim*sizeof(*bogus_cv));
    for ( i = 0; i < cv_dim; i++ )
      bogus_cv[i] = ON_UNSET_VALUE;
    for(i = 0; i < m_cv_count[0] && rc; i++)
    {
      for(j = 0; j < m_cv_count[1] && rc; j++)
      {
        for ( k = 0; k < m_cv_count[2] && rc; k++)
        {
          const double* cv = CV(i,j,k);
          if ( !cv )
            cv = bogus_cv;
          rc = archive.WriteDouble(cv_dim,cv);
        }
      }
    }

    if ( !archive.EndWrite3dmChunk() )
    {
      rc = false;
    }
  }

  return rc;
}